

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::XPathMatcher::endElement
          (XPathMatcher *this,XMLElementDecl *elemDecl,XMLCh *elemContent,
          ValidationContext *validationContext,DatatypeValidator *actualValidator)

{
  XMLSize_t XVar1;
  int iVar2;
  int iVar3;
  ValueStackOf<unsigned_long> *this_00;
  unsigned_long uVar4;
  undefined4 extraout_var;
  XMLCh *toDelete;
  undefined4 extraout_var_01;
  uchar *puVar5;
  DatatypeValidator *pDVar6;
  XMLSize_t getAt;
  XMLSize_t endIndex;
  byte bVar7;
  XMLBuffer buff;
  ArrayJanitor<char16_t> janPrefix;
  XMLBuffer local_90;
  ValidationContext *local_58;
  XMLCh *local_50;
  DatatypeValidator *local_48;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var_00;
  
  if (this->fLocationPathSize != 0) {
    local_50 = elemContent + 1;
    getAt = 0;
    local_58 = validationContext;
    local_48 = actualValidator;
    do {
      this_00 = BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>::elementAt
                          (&this->fStepIndexes->
                            super_BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>,getAt);
      uVar4 = ValueStackOf<unsigned_long>::pop(this_00);
      this->fCurrentStep[getAt] = uVar4;
      XVar1 = this->fNoMatchDepth[getAt];
      if (XVar1 == 0) {
        puVar5 = this->fMatched;
        if (puVar5[getAt] != 0) {
          if ((~puVar5[getAt] & 3) != 0) {
            if (local_48 == (DatatypeValidator *)0x0) {
              pDVar6 = *(DatatypeValidator **)&elemDecl[2].fCreateReason;
              bVar7 = *(byte *)&elemDecl[1].fElementName & 1;
              if (pDVar6 != (DatatypeValidator *)0x0) goto LAB_00311be9;
              pDVar6 = (DatatypeValidator *)0x0;
LAB_00311d90:
              (*this->_vptr_XPathMatcher[6])(this,elemContent,pDVar6,(ulong)bVar7);
            }
            else {
              bVar7 = *(byte *)&elemDecl[1].fElementName & 1;
              pDVar6 = local_48;
LAB_00311be9:
              if (pDVar6->fType != QName) goto LAB_00311d90;
              iVar2 = XMLString::indexOf(elemContent,L':');
              if (iVar2 == -1) {
                (*this->_vptr_XPathMatcher[6])(this,elemContent,pDVar6,(ulong)bVar7);
              }
              else {
                local_90.fMemoryManager = this->fMemoryManager;
                local_90.fIndex = 0;
                local_90.fCapacity = 0x3ff;
                local_90.fFullSize = 0;
                local_90.fUsed = false;
                local_90.fFullHandler = (XMLBufferFullHandler *)0x0;
                local_90.fBuffer = (XMLCh *)0x0;
                iVar3 = (*(local_90.fMemoryManager)->_vptr_MemoryManager[3])
                                  (local_90.fMemoryManager,0x800);
                local_90.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar3);
                *local_90.fBuffer = L'\0';
                if (local_90.fIndex == local_90.fCapacity) {
                  XMLBuffer::ensureCapacity(&local_90,1);
                }
                XVar1 = local_90.fIndex + 1;
                local_90.fBuffer[local_90.fIndex] = L'{';
                endIndex = (XMLSize_t)iVar2;
                local_90.fIndex = XVar1;
                if (local_58 != (ValidationContext *)0x0) {
                  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                    (this->fMemoryManager,endIndex * 2 + 2);
                  toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar2);
                  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,this->fMemoryManager);
                  XMLString::subString(toDelete,elemContent,0,endIndex,this->fMemoryManager);
                  iVar2 = (*local_58->_vptr_ValidationContext[0xf])(local_58,toDelete);
                  XMLBuffer::append(&local_90,(XMLCh *)CONCAT44(extraout_var_01,iVar2));
                  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
                }
                if (local_90.fIndex == local_90.fCapacity) {
                  XMLBuffer::ensureCapacity(&local_90,1);
                }
                local_90.fBuffer[local_90.fIndex] = L'}';
                local_90.fIndex = local_90.fIndex + 1;
                XMLBuffer::append(&local_90,local_50 + endIndex);
                local_90.fBuffer[local_90.fIndex] = L'\0';
                (*this->_vptr_XPathMatcher[6])(this,local_90.fBuffer,pDVar6,(ulong)bVar7);
                (*(local_90.fMemoryManager)->_vptr_MemoryManager[4])
                          (local_90.fMemoryManager,local_90.fBuffer);
              }
            }
            puVar5 = this->fMatched;
          }
          puVar5[getAt] = '\0';
        }
      }
      else {
        this->fNoMatchDepth[getAt] = XVar1 - 1;
      }
      getAt = getAt + 1;
    } while (getAt < this->fLocationPathSize);
  }
  return;
}

Assistant:

void XPathMatcher::endElement(const XMLElementDecl& elemDecl,
                              const XMLCh* const elemContent,
                              ValidationContext* validationContext /*=0*/,
                              DatatypeValidator* actualValidator /*=0*/) {

    for(XMLSize_t i = 0; i < fLocationPathSize; i++) {

        // go back a step
        fCurrentStep[i] = fStepIndexes->elementAt(i)->pop();

        // don't do anything, if not matching
        if (fNoMatchDepth[i] > 0) {
            fNoMatchDepth[i]--;
        }
        // signal match, if appropriate
        else {

            if (fMatched[i] == 0)
                continue;
            
            if ((fMatched[i] & XP_MATCHED_A) == XP_MATCHED_A) {
                fMatched[i] = 0;
                continue;
            }

            DatatypeValidator* dv = actualValidator?actualValidator:((SchemaElementDecl*) &elemDecl)->getDatatypeValidator();
            bool isNillable = (((SchemaElementDecl *) &elemDecl)->getMiscFlags() & SchemaSymbols::XSD_NILLABLE) != 0;

            // store QName using their Clark name
            if(dv && dv->getType()==DatatypeValidator::QName)
            {
                int index=XMLString::indexOf(elemContent, chColon);
                if(index==-1)
                    matched(elemContent, dv, isNillable);
                else
                {
                    XMLBuffer buff(1023, fMemoryManager);
                    buff.append(chOpenCurly);
                    if(validationContext)
                    {
                        XMLCh* prefix=(XMLCh*)fMemoryManager->allocate((index+1)*sizeof(XMLCh));
                        ArrayJanitor<XMLCh> janPrefix(prefix, fMemoryManager);
                        XMLString::subString(prefix, elemContent, 0, (XMLSize_t)index, fMemoryManager);
                        buff.append(validationContext->getURIForPrefix(prefix));
                    }
                    buff.append(chCloseCurly);
                    buff.append(elemContent+index+1);
                    matched(buff.getRawBuffer(), dv, isNillable);
                }
            }
            else
                matched(elemContent, dv, isNillable);
            fMatched[i] = 0;
        }
    }
}